

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void postprocess_cpu_params(cpu_params *cpuparams,cpu_params *role_model)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  ulong uVar5;
  undefined1 auVar6 [13];
  int32_t iVar7;
  long lVar8;
  common_log *log;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  
  if (cpuparams->n_threads < 0) {
    if (role_model == (cpu_params *)0x0) {
      iVar7 = cpu_get_num_math();
      cpuparams->n_threads = iVar7;
    }
    else {
      memcpy(cpuparams,role_model,0x214);
    }
  }
  lVar8 = 4;
  iVar9 = 0;
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  do {
    uVar1 = *(undefined4 *)(cpuparams->cpumask + lVar8 + -4);
    uVar5 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar5;
    auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar3[8] = (char)((uint)uVar1 >> 0x10);
    auVar3._0_8_ = uVar5;
    auVar3[9] = 0;
    auVar3._10_3_ = auVar2._10_3_;
    auVar6._5_8_ = 0;
    auVar6._0_5_ = auVar3._8_5_;
    auVar4[4] = (char)((uint)uVar1 >> 8);
    auVar4._0_4_ = (int)uVar5;
    auVar4[5] = 0;
    auVar4._6_7_ = SUB137(auVar6 << 0x40,6);
    iVar9 = iVar9 + (int)uVar5;
    iVar10 = iVar10 + auVar4._4_4_;
    iVar11 = iVar11 + auVar3._8_4_;
    iVar12 = iVar12 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x204);
  iVar9 = iVar12 + iVar10 + iVar11 + iVar9;
  if (((iVar9 != 0) && (iVar9 < cpuparams->n_threads)) && (-1 < common_log_verbosity_thold)) {
    log = common_log_main();
    common_log_add(log,GGML_LOG_LEVEL_WARN,
                   "Not enough set bits in CPU mask (%d) to satisfy requested thread count: %d\n",
                   iVar9,(ulong)(uint)cpuparams->n_threads);
    return;
  }
  return;
}

Assistant:

void postprocess_cpu_params(cpu_params& cpuparams, const cpu_params* role_model) {
    int32_t n_set = 0;

    if (cpuparams.n_threads < 0) {
        // Assuming everything about cpuparams is invalid
        if (role_model != nullptr) {
            cpuparams = *role_model;
        } else {
            cpuparams.n_threads = cpu_get_num_math();
        }
    }

    for (int32_t i = 0; i < GGML_MAX_N_THREADS; i++) {
        if (cpuparams.cpumask[i]) {
            n_set++;
        }
    }

    if (n_set && n_set < cpuparams.n_threads) {
        // Not enough set bits, may experience performance issues.
        LOG_WRN("Not enough set bits in CPU mask (%d) to satisfy requested thread count: %d\n", n_set, cpuparams.n_threads);
    }
}